

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_state_auth_cram_resp(connectdata *conn,int imapcode,imapstate instate)

{
  size_t local_50;
  size_t len;
  char *rplyb64;
  char *chlg64;
  char *chlg;
  SessionHandle *data;
  imapstate local_20;
  CURLcode result;
  imapstate instate_local;
  int imapcode_local;
  connectdata *conn_local;
  
  data._4_4_ = 0;
  chlg = (char *)conn->data;
  chlg64 = (char *)0x0;
  rplyb64 = (char *)0x0;
  len = 0;
  local_50 = 0;
  local_20 = instate;
  result = imapcode;
  _instate_local = conn;
  if (imapcode == 0x2b) {
    imap_get_message((((SessionHandle *)chlg)->state).buffer,&rplyb64);
    data._4_4_ = Curl_sasl_decode_cram_md5_message(rplyb64,&chlg64,&local_50);
    if (data._4_4_ == CURLE_OK) {
      data._4_4_ = Curl_sasl_create_cram_md5_message
                             ((SessionHandle *)chlg,chlg64,_instate_local->user,
                              _instate_local->passwd,(char **)&len,&local_50);
      if (((data._4_4_ == CURLE_OK) && (len != 0)) &&
         (data._4_4_ = Curl_pp_sendf(&(_instate_local->proto).ftpc.pp,"%s",len),
         data._4_4_ == CURLE_OK)) {
        state(_instate_local,IMAP_AUTHENTICATE_FINAL);
      }
    }
    else {
      data._4_4_ = Curl_pp_sendf(&(_instate_local->proto).ftpc.pp,"%s","*");
      if (data._4_4_ == CURLE_OK) {
        state(_instate_local,IMAP_AUTHENTICATE_CANCEL);
      }
    }
    if (chlg64 != (char *)0x0) {
      (*Curl_cfree)(chlg64);
      chlg64 = (char *)0x0;
    }
    if (len != 0) {
      (*Curl_cfree)((void *)len);
    }
    conn_local._4_4_ = data._4_4_;
  }
  else {
    Curl_failf((SessionHandle *)chlg,"Access denied: %d",(ulong)(uint)imapcode);
    conn_local._4_4_ = CURLE_LOGIN_DENIED;
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode imap_state_auth_cram_resp(struct connectdata *conn,
                                          int imapcode,
                                          imapstate instate)
{
  CURLcode result = CURLE_OK;
  struct SessionHandle *data = conn->data;
  char *chlg = NULL;
  char *chlg64 = NULL;
  char *rplyb64 = NULL;
  size_t len = 0;

  (void)instate; /* no use for this yet */

  if(imapcode != '+') {
    failf(data, "Access denied: %d", imapcode);
    return CURLE_LOGIN_DENIED;
  }

  /* Get the challenge message */
  imap_get_message(data->state.buffer, &chlg64);

  /* Decode the challenge message */
  result = Curl_sasl_decode_cram_md5_message(chlg64, &chlg, &len);
  if(result) {
    /* Send the cancellation */
    result = Curl_pp_sendf(&conn->proto.imapc.pp, "%s", "*");

    if(!result)
      state(conn, IMAP_AUTHENTICATE_CANCEL);
  }
  else {
    /* Create the response message */
    result = Curl_sasl_create_cram_md5_message(data, chlg, conn->user,
                                               conn->passwd, &rplyb64, &len);
    if(!result && rplyb64) {
      /* Send the response */
      result = Curl_pp_sendf(&conn->proto.imapc.pp, "%s", rplyb64);

      if(!result)
        state(conn, IMAP_AUTHENTICATE_FINAL);
    }
  }

  Curl_safefree(chlg);
  Curl_safefree(rplyb64);

  return result;
}